

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

void evsig_handler(int sig)

{
  int iVar1;
  int *piVar2;
  uint8_t msg;
  undefined1 local_19;
  
  piVar2 = __errno_location();
  if (evsig_base != (event_base *)0x0) {
    iVar1 = *piVar2;
    local_19 = (undefined1)sig;
    write(evsig_base_fd,&local_19,1);
    *piVar2 = iVar1;
    return;
  }
  event_warnx("%s: received signal %d, but have no base configured","evsig_handler",sig);
  return;
}

Assistant:

static void __cdecl
evsig_handler(int sig)
{
	int save_errno = errno;
#ifdef _WIN32
	int socket_errno = EVUTIL_SOCKET_ERROR();
#endif
	ev_uint8_t msg;

	if (evsig_base == NULL) {
		event_warnx(
			"%s: received signal %d, but have no base configured",
			__func__, sig);
		return;
	}

#ifndef EVENT__HAVE_SIGACTION
	signal(sig, evsig_handler);
#endif

	/* Wake up our notification mechanism */
	msg = sig;
#ifdef _WIN32
	send(evsig_base_fd, (char*)&msg, 1, 0);
#else
	{
		int r = write(evsig_base_fd, (char*)&msg, 1);
		(void)r; /* Suppress 'unused return value' and 'unused var' */
	}
#endif
	errno = save_errno;
#ifdef _WIN32
	EVUTIL_SET_SOCKET_ERROR(socket_errno);
#endif
}